

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-pipe.c
# Opt level: O2

int lws_plat_pipe_create(lws *wsi)

{
  char cVar1;
  lws_context *plVar2;
  int iVar3;
  
  plVar2 = wsi->context;
  cVar1 = wsi->tsi;
  iVar3 = eventfd(0,0x80800);
  plVar2->pt[cVar1].dummy_pipe_fds[0] = iVar3;
  plVar2->pt[cVar1].dummy_pipe_fds[1] = -1;
  return iVar3 >> 0x1f;
}

Assistant:

int
lws_plat_pipe_create(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
#if defined(LWS_HAVE_EVENTFD)
	pt->dummy_pipe_fds[0] = eventfd(0, EFD_CLOEXEC|EFD_NONBLOCK);
	pt->dummy_pipe_fds[1] = -1;
	return pt->dummy_pipe_fds[0]<0?-1:0;
#elif defined(LWS_HAVE_PIPE2)
	return pipe2(pt->dummy_pipe_fds, O_NONBLOCK);
#else
	return pipe(pt->dummy_pipe_fds);
#endif
}